

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_Ssl.cpp
# Opt level: O0

bool __thiscall axl::io::Ssl::create(Ssl *this,SSL_CTX *ctx)

{
  bool bVar1;
  SSL *pSVar2;
  int in_ESI;
  undefined4 in_register_00000034;
  Handle<ssl_st_*,_axl::io::FreeSsl,_axl::sl::Zero<ssl_st_*>_> *in_RDI;
  
  sl::Handle<ssl_st_*,_axl::io::FreeSsl,_axl::sl::Zero<ssl_st_*>_>::close(in_RDI,in_ESI);
  pSVar2 = SSL_new((SSL_CTX *)CONCAT44(in_register_00000034,in_ESI));
  in_RDI->m_h = (ssl_st *)pSVar2;
  bVar1 = cry::completeWithLastCryptoError(0);
  return bVar1;
}

Assistant:

bool
Ssl::create(SSL_CTX* ctx) {
	close();

	m_h = SSL_new(ctx);
	return cry::completeWithLastCryptoError(m_h != NULL);
}